

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_event_push(ui_event *ke)

{
  ui_event **ppuVar1;
  undefined3 uVar2;
  ui_event *puVar3;
  ushort uVar4;
  ui_event *ke_local;
  
  if (ke == (ui_event *)0x0) {
    ke_local._4_4_ = -1;
  }
  else {
    if (Term->key_tail == 0) {
      Term->key_tail = Term->key_size;
    }
    ppuVar1 = &Term->key_queue;
    uVar4 = Term->key_tail - 1;
    Term->key_tail = uVar4;
    puVar3 = *ppuVar1 + uVar4;
    puVar3->mouse = ke->mouse;
    uVar2 = *(undefined3 *)((long)ke + 9);
    *(uint8_t *)((long)puVar3 + 8) = *(uint8_t *)((long)ke + 8);
    *(undefined3 *)((long)puVar3 + 9) = uVar2;
    if (Term->key_head == Term->key_tail) {
      ke_local._4_4_ = 1;
    }
    else {
      ke_local._4_4_ = 0;
    }
  }
  return ke_local._4_4_;
}

Assistant:

errr Term_event_push(const ui_event *ke)
{
	/* Hack -- Refuse to enqueue non-keys */
	if (!ke) return (-1);

	/* Hack -- Overflow may induce circular queue */
	if (Term->key_tail == 0) Term->key_tail = Term->key_size;

	/* Back up, Store the char */
	/* Store the char, advance the queue */
	Term->key_queue[--Term->key_tail] = *ke;

	/* Success (unless overflow) */
	if (Term->key_head != Term->key_tail) return (0);

	/* Problem */
	return (1);
}